

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  fmt_helper *dest_00;
  bool bVar1;
  size_t sVar2;
  rep rVar3;
  string_view_t *psVar4;
  memory_buf_t *dest_01;
  string_view_t view;
  string_view_t view_00;
  string_view_t view_01;
  string_view_t view_02;
  char local_d3 [3];
  mdc_map_t *local_d0;
  mdc_map_t *mdc_map;
  fmt_helper *local_c0;
  fmt_helper *local_b0;
  char *filename;
  fmt_helper *local_a0;
  char *local_98;
  char local_8b [3];
  fmt_helper *local_88;
  char *local_80;
  char local_73 [3];
  duration local_70;
  duration<long,_std::ratio<1L,_1000L>_> local_68;
  duration<long,_std::ratio<1L,_1000L>_> millis;
  duration<long,_std::ratio<1L,_1L>_> local_58;
  __enable_if_is_duration<std::chrono::duration<long>_> secs;
  duration duration;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *msg_local;
  full_formatter *this_local;
  
  secs.__r = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch(&msg->time);
  local_58.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)&secs);
  bVar1 = std::chrono::operator!=(&this->cache_timestamp_,&local_58);
  if (!bVar1) {
    sVar2 = fmt::v10::detail::buffer<char>::size(&(this->cached_datetime_).super_buffer<char>);
    if (sVar2 != 0) goto LAB_003facff;
  }
  fmt::v10::detail::buffer<char>::clear(&(this->cached_datetime_).super_buffer<char>);
  millis.__r._7_1_ = 0x5b;
  fmt::v10::detail::buffer<char>::push_back
            (&(this->cached_datetime_).super_buffer<char>,(char *)((long)&millis.__r + 7));
  fmt_helper::append_int<int>(tm_time->tm_year + 0x76c,&this->cached_datetime_);
  millis.__r._6_1_ = 0x2d;
  fmt::v10::detail::buffer<char>::push_back
            (&(this->cached_datetime_).super_buffer<char>,(char *)((long)&millis.__r + 6));
  fmt_helper::pad2(tm_time->tm_mon + 1,&this->cached_datetime_);
  millis.__r._5_1_ = 0x2d;
  fmt::v10::detail::buffer<char>::push_back
            (&(this->cached_datetime_).super_buffer<char>,(char *)((long)&millis.__r + 5));
  fmt_helper::pad2(tm_time->tm_mday,&this->cached_datetime_);
  millis.__r._4_1_ = 0x20;
  fmt::v10::detail::buffer<char>::push_back
            (&(this->cached_datetime_).super_buffer<char>,(char *)((long)&millis.__r + 4));
  fmt_helper::pad2(tm_time->tm_hour,&this->cached_datetime_);
  millis.__r._3_1_ = 0x3a;
  fmt::v10::detail::buffer<char>::push_back
            (&(this->cached_datetime_).super_buffer<char>,(char *)((long)&millis.__r + 3));
  fmt_helper::pad2(tm_time->tm_min,&this->cached_datetime_);
  millis.__r._2_1_ = 0x3a;
  fmt::v10::detail::buffer<char>::push_back
            (&(this->cached_datetime_).super_buffer<char>,(char *)((long)&millis.__r + 2));
  fmt_helper::pad2(tm_time->tm_sec,&this->cached_datetime_);
  millis.__r._1_1_ = 0x2e;
  fmt::v10::detail::buffer<char>::push_back
            (&(this->cached_datetime_).super_buffer<char>,(char *)((long)&millis.__r + 1));
  (this->cache_timestamp_).__r = local_58.__r;
LAB_003facff:
  fmt::v10::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,(this->cached_datetime_).super_buffer<char>.ptr_,
             (this->cached_datetime_).super_buffer<char>.ptr_ +
             (this->cached_datetime_).super_buffer<char>.size_);
  local_70.__r = (msg->time).__d.__r;
  local_68 = fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000l>>>
                       (local_70.__r);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_68);
  fmt_helper::pad3<unsigned_int>((uint)rVar3,dest);
  local_73[2] = 0x5d;
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_73 + 2);
  local_73[1] = 0x20;
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_73 + 1);
  sVar2 = fmt::v10::basic_string_view<char>::size(&msg->logger_name);
  if (sVar2 != 0) {
    local_73[0] = '[';
    fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_73);
    local_88 = (fmt_helper *)(msg->logger_name).data_;
    local_80 = (char *)(msg->logger_name).size_;
    view.size_ = (size_t)dest;
    view.data_ = local_80;
    fmt_helper::append_string_view(local_88,view,(memory_buf_t *)local_88);
    local_8b[2] = 0x5d;
    fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_8b + 2);
    local_8b[1] = 0x20;
    fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_8b + 1);
  }
  local_8b[0] = '[';
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_8b);
  sVar2 = fmt::v10::detail::buffer<char>::size(&dest->super_buffer<char>);
  msg->color_range_start = sVar2;
  psVar4 = level::to_string_view(msg->level);
  local_a0 = (fmt_helper *)psVar4->data_;
  local_98 = (char *)psVar4->size_;
  view_00.size_ = (size_t)dest;
  view_00.data_ = local_98;
  fmt_helper::append_string_view(local_a0,view_00,(memory_buf_t *)local_a0);
  sVar2 = fmt::v10::detail::buffer<char>::size(&dest->super_buffer<char>);
  msg->color_range_end = sVar2;
  filename._7_1_ = 0x5d;
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,(char *)((long)&filename + 7))
  ;
  filename._6_1_ = 0x20;
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,(char *)((long)&filename + 6))
  ;
  bVar1 = source_loc::empty(&msg->source);
  if (!bVar1) {
    filename._5_1_ = 0x5b;
    fmt::v10::detail::buffer<char>::push_back
              (&dest->super_buffer<char>,(char *)((long)&filename + 5));
    local_c0 = (fmt_helper *)
               short_filename_formatter<spdlog::details::null_scoped_padder>::basename
                         ((msg->source).filename);
    local_b0 = local_c0;
    dest_01 = (memory_buf_t *)std::char_traits<char>::length((char_type *)local_c0);
    view_01.size_ = (size_t)dest;
    view_01.data_ = (char *)dest_01;
    fmt_helper::append_string_view(local_c0,view_01,dest_01);
    mdc_map._7_1_ = 0x3a;
    fmt::v10::detail::buffer<char>::push_back
              (&dest->super_buffer<char>,(char *)((long)&mdc_map + 7));
    fmt_helper::append_int<int>((msg->source).line,dest);
    mdc_map._6_1_ = 0x5d;
    fmt::v10::detail::buffer<char>::push_back
              (&dest->super_buffer<char>,(char *)((long)&mdc_map + 6));
    mdc_map._5_1_ = 0x20;
    fmt::v10::detail::buffer<char>::push_back
              (&dest->super_buffer<char>,(char *)((long)&mdc_map + 5));
  }
  local_d0 = mdc::get_context_abi_cxx11_();
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(local_d0);
  if (!bVar1) {
    local_d3[2] = 0x5b;
    fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_d3 + 2);
    mdc_formatter<spdlog::details::null_scoped_padder>::format_mdc
              (&this->mdc_formatter_,local_d0,dest);
    local_d3[1] = 0x5d;
    fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_d3 + 1);
    local_d3[0] = ' ';
    fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_d3);
  }
  dest_00 = (fmt_helper *)(msg->payload).data_;
  view_02.size_ = (size_t)dest;
  view_02.data_ = (char *)(msg->payload).size_;
  fmt_helper::append_string_view(dest_00,view_02,(memory_buf_t *)dest_00);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0) {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

        // append logger name if exists
        if (msg.logger_name.size() > 0) {
            dest.push_back('[');
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty()) {
            dest.push_back('[');
            const char *filename =
                details::short_filename_formatter<details::null_scoped_padder>::basename(
                    msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

        // add mdc if present
        auto &mdc_map = mdc::get_context();
        if (!mdc_map.empty()) {
            dest.push_back('[');
            mdc_formatter_.format_mdc(mdc_map, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }